

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCursesCacheEntryComposite.cxx
# Opt level: O2

void __thiscall
cmCursesCacheEntryComposite::cmCursesCacheEntryComposite
          (cmCursesCacheEntryComposite *this,string *key,int labelwidth,int entrywidth)

{
  _Head_base<0UL,_cmCursesLabelWidget_*,_false> _Var1;
  cmCursesLabelWidget *pcVar2;
  cmCursesWidget *pcVar3;
  _Head_base<0UL,_cmCursesWidget_*,_false> _Var4;
  int iVar5;
  _Head_base<0UL,_cmCursesWidget_*,_false> local_58;
  int local_4c;
  int local_48;
  int local_44;
  string *local_40;
  char local_34 [4];
  
  local_40 = &this->Key;
  (this->Label)._M_t.
  super___uniq_ptr_impl<cmCursesLabelWidget,_std::default_delete<cmCursesLabelWidget>_>._M_t.
  super__Tuple_impl<0UL,_cmCursesLabelWidget_*,_std::default_delete<cmCursesLabelWidget>_>.
  super__Head_base<0UL,_cmCursesLabelWidget_*,_false>._M_head_impl = (cmCursesLabelWidget *)0x0;
  (this->IsNewLabel)._M_t.
  super___uniq_ptr_impl<cmCursesLabelWidget,_std::default_delete<cmCursesLabelWidget>_>._M_t.
  super__Tuple_impl<0UL,_cmCursesLabelWidget_*,_std::default_delete<cmCursesLabelWidget>_>.
  super__Head_base<0UL,_cmCursesLabelWidget_*,_false>._M_head_impl = (cmCursesLabelWidget *)0x0;
  (this->Entry)._M_t.super___uniq_ptr_impl<cmCursesWidget,_std::default_delete<cmCursesWidget>_>.
  _M_t.super__Tuple_impl<0UL,_cmCursesWidget_*,_std::default_delete<cmCursesWidget>_>.
  super__Head_base<0UL,_cmCursesWidget_*,_false>._M_head_impl = (cmCursesWidget *)0x0;
  std::__cxx11::string::string((string *)local_40,(string *)key);
  this->LabelWidth = labelwidth;
  this->EntryWidth = entrywidth;
  iVar5 = 1;
  local_4c = iVar5;
  local_48 = iVar5;
  local_44 = iVar5;
  std::make_unique<cmCursesLabelWidget,int&,int,int,int,std::__cxx11::string_const&>
            ((int *)&local_58,&this->LabelWidth,&local_44,&local_48,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_4c);
  _Var4._M_head_impl = local_58._M_head_impl;
  local_58._M_head_impl = (cmCursesWidget *)0x0;
  _Var1._M_head_impl =
       (this->Label)._M_t.
       super___uniq_ptr_impl<cmCursesLabelWidget,_std::default_delete<cmCursesLabelWidget>_>._M_t.
       super__Tuple_impl<0UL,_cmCursesLabelWidget_*,_std::default_delete<cmCursesLabelWidget>_>.
       super__Head_base<0UL,_cmCursesLabelWidget_*,_false>._M_head_impl;
  (this->Label)._M_t.
  super___uniq_ptr_impl<cmCursesLabelWidget,_std::default_delete<cmCursesLabelWidget>_>._M_t.
  super__Tuple_impl<0UL,_cmCursesLabelWidget_*,_std::default_delete<cmCursesLabelWidget>_>.
  super__Head_base<0UL,_cmCursesLabelWidget_*,_false>._M_head_impl =
       (cmCursesLabelWidget *)_Var4._M_head_impl;
  if (_Var1._M_head_impl != (cmCursesLabelWidget *)0x0) {
    (**(code **)(*(long *)&(_Var1._M_head_impl)->super_cmCursesWidget + 8))();
    if (local_58._M_head_impl != (cmCursesWidget *)0x0) {
      (*((cmCursesWidget *)&(local_58._M_head_impl)->_vptr_cmCursesWidget)->_vptr_cmCursesWidget[1])
                ();
    }
  }
  local_4c = iVar5;
  local_48 = iVar5;
  local_44 = iVar5;
  local_34 = (char  [4])iVar5;
  std::make_unique<cmCursesLabelWidget,int,int,int,int,char_const(&)[2]>
            ((int *)&local_58,&local_44,&local_48,&local_4c,(char (*) [2])local_34);
  _Var4._M_head_impl = local_58._M_head_impl;
  local_58._M_head_impl = (cmCursesWidget *)0x0;
  pcVar2 = (this->IsNewLabel)._M_t.
           super___uniq_ptr_impl<cmCursesLabelWidget,_std::default_delete<cmCursesLabelWidget>_>.
           _M_t.
           super__Tuple_impl<0UL,_cmCursesLabelWidget_*,_std::default_delete<cmCursesLabelWidget>_>.
           super__Head_base<0UL,_cmCursesLabelWidget_*,_false>._M_head_impl;
  (this->IsNewLabel)._M_t.
  super___uniq_ptr_impl<cmCursesLabelWidget,_std::default_delete<cmCursesLabelWidget>_>._M_t.
  super__Tuple_impl<0UL,_cmCursesLabelWidget_*,_std::default_delete<cmCursesLabelWidget>_>.
  super__Head_base<0UL,_cmCursesLabelWidget_*,_false>._M_head_impl =
       (cmCursesLabelWidget *)_Var4._M_head_impl;
  if (pcVar2 != (cmCursesLabelWidget *)0x0) {
    (**(code **)((long)(pcVar2->super_cmCursesWidget)._vptr_cmCursesWidget + 8))();
    if (local_58._M_head_impl != (cmCursesWidget *)0x0) {
      (*(local_58._M_head_impl)->_vptr_cmCursesWidget[1])();
    }
  }
  local_4c = iVar5;
  local_48 = iVar5;
  local_44 = iVar5;
  std::make_unique<cmCursesStringWidget,int&,int,int,int>
            ((int *)&local_58,&this->EntryWidth,&local_44,&local_48);
  _Var4._M_head_impl = local_58._M_head_impl;
  local_58._M_head_impl = (cmCursesWidget *)0x0;
  pcVar3 = (this->Entry)._M_t.
           super___uniq_ptr_impl<cmCursesWidget,_std::default_delete<cmCursesWidget>_>._M_t.
           super__Tuple_impl<0UL,_cmCursesWidget_*,_std::default_delete<cmCursesWidget>_>.
           super__Head_base<0UL,_cmCursesWidget_*,_false>._M_head_impl;
  (this->Entry)._M_t.super___uniq_ptr_impl<cmCursesWidget,_std::default_delete<cmCursesWidget>_>.
  _M_t.super__Tuple_impl<0UL,_cmCursesWidget_*,_std::default_delete<cmCursesWidget>_>.
  super__Head_base<0UL,_cmCursesWidget_*,_false>._M_head_impl = _Var4._M_head_impl;
  if (pcVar3 != (cmCursesWidget *)0x0) {
    (*pcVar3->_vptr_cmCursesWidget[1])();
    if (local_58._M_head_impl != (cmCursesWidget *)0x0) {
      (*(local_58._M_head_impl)->_vptr_cmCursesWidget[1])();
    }
  }
  return;
}

Assistant:

cmCursesCacheEntryComposite::cmCursesCacheEntryComposite(
  const std::string& key, int labelwidth, int entrywidth)
  : Key(key)
  , LabelWidth(labelwidth)
  , EntryWidth(entrywidth)
{
  this->Label =
    cm::make_unique<cmCursesLabelWidget>(this->LabelWidth, 1, 1, 1, key);
  this->IsNewLabel = cm::make_unique<cmCursesLabelWidget>(1, 1, 1, 1, " ");
  this->Entry =
    cm::make_unique<cmCursesStringWidget>(this->EntryWidth, 1, 1, 1);
}